

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

string * __thiscall
cmComputeLinkInformation::FeatureDescriptor::GetDecoratedItem
          (string *__return_storage_ptr__,FeatureDescriptor *this,string *library,ItemIsPath isPath)

{
  pointer pcVar1;
  string *psVar2;
  string format;
  FeaturePlaceHolderExpander expander;
  string local_60;
  cmPlaceholderExpander local_40;
  string *local_38;
  string *local_30;
  string *local_28;
  
  pcVar1 = (&this->ItemPathFormat)[isPath != Yes]._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,
             pcVar1 + (&this->ItemPathFormat)[isPath != Yes]._M_string_length);
  local_40._vptr_cmPlaceholderExpander = (_func_int **)&PTR__cmPlaceholderExpander_00aa7f10;
  local_38 = library;
  local_30 = library;
  local_28 = library;
  psVar2 = cmPlaceholderExpander::ExpandVariables(&local_40,&local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmComputeLinkInformation::FeatureDescriptor::GetDecoratedItem(
  std::string const& library, ItemIsPath isPath) const
{
  auto format =
    isPath == ItemIsPath::Yes ? this->ItemPathFormat : this->ItemNameFormat;

  // replace <LIBRARY>, <LIB_ITEM> and <LINK_ITEM> patterns with library path
  FeaturePlaceHolderExpander expander(&library, &library, &library);
  return expander.ExpandVariables(format);
}